

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall IR::Instr::IsEqual(Instr *this,Instr *compareInstr)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  IRKind IVar4;
  undefined4 *puVar5;
  Opnd *this_00;
  Opnd *this_01;
  Opnd *this_02;
  Opnd *opnd;
  Opnd *opnd_00;
  Opnd *opnd_01;
  Opnd *compareSrc2;
  Opnd *compareSrc1;
  Opnd *compareDst;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  Instr *compareInstr_local;
  Instr *this_local;
  
  if (compareInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x9b,"(compareInstr)","compareInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  IVar3 = GetKind(this);
  IVar4 = GetKind(compareInstr);
  if ((IVar3 != IVar4) || (this->m_opcode != compareInstr->m_opcode)) {
    return false;
  }
  this_00 = GetDst(this);
  this_01 = GetSrc1(this);
  this_02 = GetSrc2(this);
  opnd = GetDst(compareInstr);
  opnd_00 = GetSrc1(compareInstr);
  opnd_01 = GetSrc2(compareInstr);
  if ((this_00 != opnd) &&
     (((this_00 == (Opnd *)0x0 || (opnd == (Opnd *)0x0)) ||
      (bVar2 = Opnd::IsEqual(this_00,opnd), !bVar2)))) {
    return false;
  }
  if ((this_01 != opnd_00) &&
     (((this_01 == (Opnd *)0x0 || (opnd_00 == (Opnd *)0x0)) ||
      (bVar2 = Opnd::IsEqual(this_01,opnd_00), !bVar2)))) {
    return false;
  }
  if ((this_02 == opnd_01) ||
     (((this_02 != (Opnd *)0x0 && (opnd_01 != (Opnd *)0x0)) &&
      (bVar2 = Opnd::IsEqual(this_02,opnd_01), bVar2)))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
Instr::IsEqual(IR::Instr *compareInstr) const
{
    Assert(compareInstr);
    if (this->GetKind() == compareInstr->GetKind()
        && this->m_opcode == compareInstr->m_opcode)
    {
        IR::Opnd *dst = this->GetDst();
        IR::Opnd *src1 = this->GetSrc1();
        IR::Opnd *src2 = this->GetSrc2();
        IR::Opnd *compareDst = compareInstr->GetDst();
        IR::Opnd *compareSrc1 = compareInstr->GetSrc1();
        IR::Opnd *compareSrc2 = compareInstr->GetSrc2();

        // when both dst and compareDst are null, they are equal, same applies to src1, src2
        if ((dst != compareDst) && (!dst || !compareDst || !dst->IsEqual(compareDst)))
        {
            return false;
        }
        if ((src1 != compareSrc1) && (!src1 || !compareSrc1 || !src1->IsEqual(compareSrc1)))
        {
            return false;
        }
        if ((src2 != compareSrc2) && (!src2 || !compareSrc2 || !src2->IsEqual(compareSrc2)))
        {
            return false;
        }

        return true;
    }
    else
    {
        return false;
    }
}